

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O3

void __thiscall QTextTable::insertColumns(QTextTable *this,int pos,int num)

{
  long lVar1;
  QTextFormatCollection *this_00;
  uint *puVar2;
  QTextTablePrivate *this_01;
  QTextDocumentPrivate *this_02;
  pointer piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int charFormat;
  int blockFormat;
  long lVar7;
  ulong uVar8;
  uint fragment;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QList<int> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < num) {
    uVar13 = (ulong)(uint)pos;
    this_01 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_01->dirty == true) {
      QTextTablePrivate::update(this_01);
    }
    uVar9 = this_01->nCols;
    if ((int)uVar9 < pos) {
      uVar13 = (ulong)uVar9;
    }
    if (pos < 0) {
      uVar13 = (ulong)uVar9;
    }
    this_02 = (this_01->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    iVar5 = this_02->editBlock;
    this_02->editBlock = iVar5 + 1;
    if (iVar5 == 0) {
      this_02->revision = this_02->revision + 1;
    }
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (int *)0x0;
    local_98.d.size = 0;
    iVar5 = this_01->nRows;
    iVar4 = (int)uVar13;
    if (0 < iVar5) {
      this_00 = &this_02->formats;
      puVar2 = &(this_01->super_QTextFramePrivate).fragment_end;
      iVar12 = 0;
      do {
        iVar6 = this_01->nCols;
        if (iVar4 != iVar6 || iVar5 + -1 != iVar12) {
          if (iVar4 < 1) {
            iVar5 = -1;
LAB_0052d978:
            uVar8 = (ulong)(iVar6 * iVar12 + iVar4);
            do {
              piVar3 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <=
                  uVar8) {
                insertColumns();
                goto LAB_0052deea;
              }
              fragment = piVar3[uVar8];
              iVar6 = QTextTablePrivate::findCellIndex(this_01,fragment);
              if (iVar5 <= iVar6) goto LAB_0052d9ed;
              uVar8 = uVar8 + 1;
              lVar7 = (long)this_01->nCols * (long)this_01->nRows;
            } while ((long)uVar8 < lVar7);
            if ((int)uVar8 == (int)lVar7) goto LAB_0052d921;
            goto LAB_0052d9ed;
          }
          uVar8 = (ulong)(iVar6 * iVar12 + iVar4 + -1);
          piVar3 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2))
          {
            iVar5 = QTextTablePrivate::findCellIndex(this_01,piVar3[uVar8]);
            iVar6 = this_01->nCols;
            goto LAB_0052d978;
          }
          goto LAB_0052deef;
        }
LAB_0052d921:
        fragment = *puVar2;
LAB_0052d9ed:
        if ((0 < iVar4) && (iVar4 < this_01->nCols)) {
          uVar8 = (ulong)(this_01->nCols * iVar12 + iVar4 + -1);
          piVar3 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2))
          {
            if (fragment != piVar3[uVar8]) goto LAB_0052dafe;
            if (local_98.d.size != 0) {
              lVar7 = 0;
              do {
                if (local_98.d.size << 2 == lVar7) goto LAB_0052da66;
                lVar1 = lVar7 + 4;
                puVar11 = (uint *)((long)local_98.d.ptr + lVar7);
                lVar7 = lVar1;
              } while (*puVar11 != fragment);
              if (lVar1 != 0) goto LAB_0052dc87;
            }
LAB_0052da66:
            stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(0xaaaaaaaa,fragment);
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &this_02->fragments;
            QTextFormatCollection::format((QTextFormatCollection *)&local_58,(int)this_00);
            QTextFormat::toCharFormat((QTextFormat *)local_78);
            QTextFormat::~QTextFormat((QTextFormat *)&local_58);
            iVar5 = QTextFormat::intProperty((QTextFormat *)local_78,0x4811);
            iVar5 = iVar5 + num + (uint)(iVar5 == 0);
            if (iVar5 < 2) {
              QTextFormat::clearProperty((QTextFormat *)local_78,0x4811);
            }
            else {
              ::QVariant::QVariant((QVariant *)&local_58,iVar5);
              QTextFormat::setProperty((QTextFormat *)local_78,0x4811,(QVariant *)&local_58);
              ::QVariant::~QVariant((QVariant *)&local_58);
            }
            iVar5 = QFragmentMap<QTextFragmentData>::ConstIterator::position
                              ((ConstIterator *)local_68);
            QTextDocumentPrivate::setCharFormat
                      (this_02,iVar5,1,(QTextCharFormat *)local_78,SetFormat);
            this_01->dirty = true;
            local_58._0_4_ = fragment;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)local_58.data);
            QList<int>::end(&local_98);
            QTextFormat::~QTextFormat((QTextFormat *)local_78);
            goto LAB_0052dc87;
          }
          goto LAB_0052def4;
        }
LAB_0052dafe:
        if ((iVar12 != 0) && (iVar5 = this_01->nCols, iVar4 < iVar5)) {
          uVar10 = (ulong)((iVar12 + -1) * iVar5 + iVar4);
          piVar3 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          if (uVar8 <= uVar10) goto LAB_0052def9;
          if (fragment != piVar3[uVar10]) goto LAB_0052db99;
          uVar9 = iVar5 * iVar12 + iVar4;
          uVar10 = (ulong)uVar9;
          iVar5 = iVar5 * this_01->nRows + -1;
          puVar11 = puVar2;
          if ((int)uVar9 < iVar5) {
            uVar10 = (ulong)(int)uVar9;
            do {
              if (uVar8 <= uVar10) goto LAB_0052deea;
              if (fragment != piVar3[uVar10]) goto LAB_0052dca7;
              uVar10 = uVar10 + 1;
            } while ((long)uVar10 < (long)iVar5);
LAB_0052dcc0:
            fragment = *puVar11;
            goto LAB_0052db99;
          }
LAB_0052dca7:
          iVar6 = (int)uVar10;
          if (iVar6 == iVar5) goto LAB_0052dcc0;
          if ((ulong)(long)iVar6 < uVar8) {
            puVar11 = (uint *)(piVar3 + iVar6);
            goto LAB_0052dcc0;
          }
          goto LAB_0052defe;
        }
LAB_0052db99:
        stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(0xaaaaaaaa,fragment);
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &this_02->fragments;
        QTextFormatCollection::format((QTextFormatCollection *)&local_58,(int)this_00);
        QTextFormat::toCharFormat((QTextFormat *)local_78);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
        QTextFormat::clearProperty((QTextFormat *)local_78,0x4810);
        QTextFormat::clearProperty((QTextFormat *)local_78,0x4811);
        iVar6 = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)local_68);
        charFormat = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)local_78);
        QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_58);
        blockFormat = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
        iVar5 = num;
        do {
          QTextDocumentPrivate::insertBlock
                    (this_02,(QChar)0xfdd0,iVar6,blockFormat,charFormat,MoveCursor);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
LAB_0052dc87:
        iVar12 = iVar12 + 1;
        iVar5 = this_01->nRows;
      } while (iVar12 < iVar5);
    }
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
    format((QTextTable *)local_68);
    iVar5 = QTextFormat::intProperty((QTextFormat *)local_68,0x4100);
    iVar12 = iVar5 + num + (uint)(iVar5 == 0);
    iVar5 = 0;
    if (iVar12 != 1) {
      iVar5 = iVar12;
    }
    ::QVariant::QVariant((QVariant *)&local_58,iVar5);
    QTextFormat::setProperty((QTextFormat *)local_68,0x4100,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::lengthVectorProperty
              ((QList<QTextLength> *)&local_58,(QTextFormat *)local_68,0x4101);
    if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x0) {
      uVar8 = 1;
      if (1 < iVar4) {
        uVar8 = uVar13;
      }
      iVar5 = num + 1;
      do {
        QtPrivate::QPodArrayOps<QTextLength>::emplace<QTextLength_const&>
                  ((QPodArrayOps<QTextLength> *)&local_58,(long)iVar4,
                   (QTextLength *)((undefined1 *)(local_58._8_8_ + uVar8 * 0x10) + -0x10));
        QList<QTextLength>::begin((QList<QTextLength> *)&local_58);
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    QTextFormat::setProperty((QTextFormat *)local_68,0x4101,(QList<QTextLength> *)&local_58);
    QTextObject::setFormat((QTextObject *)this,(QTextFormat *)local_68);
    QTextDocumentPrivate::endEditBlock(this_02);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,0x10,0x10);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0052df03:
  __stack_chk_fail();
LAB_0052deea:
  insertColumns();
LAB_0052deef:
  insertColumns();
LAB_0052def4:
  insertColumns();
LAB_0052def9:
  insertColumns();
LAB_0052defe:
  insertColumns();
  goto LAB_0052df03;
}

Assistant:

void QTextTable::insertColumns(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nCols || pos < 0)
        pos = d->nCols;

//     qDebug() << "-------- insertCols" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    QList<int> extendedSpans;
    for (int i = 0; i < d->nRows; ++i) {
        int cell;
        if (i == d->nRows - 1 && pos == d->nCols) {
            cell = d->fragment_end;
        } else {
            int logicalGridIndexBeforePosition = pos > 0
                                                 ? d->findCellIndex(d->grid[i*d->nCols + pos - 1])
                                                 : -1;

            // Search for the logical insertion point by skipping past cells which are not the first
            // cell in a rowspan. This means any cell for which the logical grid index is
            // less than the logical cell index of the cell before the insertion.
            int logicalGridIndex;
            int gridArrayOffset = i*d->nCols + pos;
            do {
                cell = d->grid[gridArrayOffset];
                logicalGridIndex = d->findCellIndex(cell);
                gridArrayOffset++;
            } while (logicalGridIndex < logicalGridIndexBeforePosition
                     && gridArrayOffset < d->nRows*d->nCols);

            if (logicalGridIndex < logicalGridIndexBeforePosition
                && gridArrayOffset == d->nRows*d->nCols)
                cell = d->fragment_end;
        }

        if (pos > 0 && pos < d->nCols && cell == d->grid[i*d->nCols + pos - 1]) {
            // cell spans the insertion place, extend it
            if (!extendedSpans.contains(cell)) {
                QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                QTextCharFormat fmt = c->charFormat(it->format);
                fmt.setTableCellColumnSpan(fmt.tableCellColumnSpan() + num);
                p->setCharFormat(it.position(), 1, fmt);
                d->dirty = true;
                extendedSpans << cell;
            }
        } else {
            /* If the next cell is spanned from the row above, we need to find the right position
            to insert to */
            if (i > 0 && pos < d->nCols && cell == d->grid[(i-1) * d->nCols + pos]) {
                int gridIndex = i*d->nCols + pos;
                const int gridEnd = d->nRows * d->nCols - 1;
                while (gridIndex < gridEnd && cell == d->grid[gridIndex]) {
                    ++gridIndex;
                }
                if (gridIndex == gridEnd)
                    cell = d->fragment_end;
                else
                    cell = d->grid[gridIndex];
            }
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = c->charFormat(it->format);
            fmt.setTableCellRowSpan(1);
            fmt.setTableCellColumnSpan(1);
            Q_ASSERT(fmt.objectIndex() == objectIndex());
            int position = it.position();
            int cfmt = p->formatCollection()->indexForFormat(fmt);
            int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
            for (int i = 0; i < num; ++i)
                p->insertBlock(QTextBeginningOfFrame, position, bfmt, cfmt, QTextUndoCommand::MoveCursor);
        }
    }

    QTextTableFormat tfmt = format();
    tfmt.setColumns(tfmt.columns()+num);
    QList<QTextLength> columnWidths = tfmt.columnWidthConstraints();
    if (! columnWidths.isEmpty()) {
        for (int i = num; i > 0; --i)
            columnWidths.insert(pos, columnWidths.at(qMax(0, pos - 1)));
    }
    tfmt.setColumnWidthConstraints (columnWidths);
    QTextObject::setFormat(tfmt);

//     qDebug() << "-------- end insertCols" << pos << num;
    p->endEditBlock();
}